

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O3

int __thiscall ON_ClippingRegion::InViewFrustum(ON_ClippingRegion *this,int count,ON_4dPoint *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  double *cv;
  int i;
  uint uVar7;
  double *xform;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  if (count == 0) {
    return 0;
  }
  uVar6 = 0xffffffff;
  uVar4 = 0;
  while( true ) {
    dVar8 = p->x;
    dVar1 = p->y;
    dVar2 = p->z;
    dVar3 = p->w;
    dVar9 = (this->m_xform).m_xform[3][3] * dVar3 +
            (this->m_xform).m_xform[3][2] * dVar2 +
            (this->m_xform).m_xform[3][0] * dVar8 + (this->m_xform).m_xform[3][1] * dVar1;
    dVar11 = (this->m_xform).m_xform[0][3] * dVar3 +
             (this->m_xform).m_xform[0][2] * dVar2 +
             (this->m_xform).m_xform[0][0] * dVar8 + dVar1 * (this->m_xform).m_xform[0][1];
    dVar10 = -dVar9;
    uVar7 = 1;
    if ((dVar10 <= dVar11) && (uVar7 = 0, dVar9 < dVar11)) {
      uVar7 = 2;
    }
    dVar11 = (this->m_xform).m_xform[1][3] * dVar3 +
             (this->m_xform).m_xform[1][2] * dVar2 +
             (this->m_xform).m_xform[1][0] * dVar8 + dVar1 * (this->m_xform).m_xform[1][1];
    if (dVar10 <= dVar11) {
      if (dVar9 < dVar11) {
        uVar7 = uVar7 | 8;
      }
    }
    else {
      uVar7 = uVar7 | 4;
    }
    dVar8 = dVar3 * (this->m_xform).m_xform[2][3] +
            dVar2 * (this->m_xform).m_xform[2][2] +
            dVar8 * (this->m_xform).m_xform[2][0] + dVar1 * (this->m_xform).m_xform[2][1];
    if (dVar10 <= dVar8) {
      if (dVar9 < dVar8) {
        uVar7 = uVar7 | 0x20;
      }
    }
    else {
      uVar7 = uVar7 | 0x10;
    }
    uVar4 = uVar4 | uVar7;
    uVar6 = uVar6 & uVar7;
    if (uVar6 == 0 && uVar4 != 0) break;
    count = count + -1;
    p = p + 1;
    if (count == 0) {
      iVar5 = (uVar4 == 0) + 1;
      if (uVar6 != 0) {
        iVar5 = 0;
      }
      return iVar5;
    }
  }
  return 1;
}

Assistant:

int ON_ClippingRegion::InViewFrustum( 
  int count, 
  const ON_4dPoint* p
  ) const
{
  const double* xform;
  const double* cv;
  double x, w;
  unsigned int out, all_out, some_out;
  int i;

  some_out = 0;
  all_out  = 0xFFFFFFFF;
  xform = &m_xform.m_xform[0][0];
  cv = &p[0].x;
  for ( i = count; i--; cv += 4 )
  {
    out = 0;
    w = xform[12]*cv[0] + xform[13]*cv[1] + xform[14]*cv[2] + xform[15]*cv[3];
    x = xform[0]*cv[0] + xform[1]*cv[1] + xform[2]*cv[2] + xform[3]*cv[3];
    if (x < -w) out  = 0x01; else if (x > w) out  = 0x02;
    x = xform[4]*cv[0] + xform[5]*cv[1] + xform[6]*cv[2] + xform[7]*cv[3];
    if (x < -w) out |= 0x04; else if (x > w) out |= 0x08;
    x = xform[8]*cv[0] + xform[9]*cv[1] + xform[10]*cv[2] + xform[11]*cv[3];
    if (x < -w) out |= 0x10; else if (x > w) out |= 0x20;
    some_out |= out;
    all_out  &= out;
    if ( some_out && !all_out )
    {
      //  no further "out" checking is necessary
      break;
    }
  }

  if ( all_out )
    i = 0;
  else if ( some_out )
    i = 1;
  else
    i = 2;

  return i;
}